

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

void doCommand(FILE *outf,int method,atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,
              atomBins *bbins,pointSet *dots,float probeRad,float density,float spikelen,
              int countDots,int rawOutput,int conFlag,char *rawname,double scoreBias,int drawSpike,
              int sayGroup,char *groupLabel,int argc,char **argv,char *message)

{
  bool bVar1;
  atom_t **ppaVar2;
  int iVar3;
  int iVar4;
  atom *allMovingAtoms_00;
  ulong uVar5;
  atom_t *paVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  atom *a;
  bool bVar12;
  bool bVar13;
  int in_stack_ffffffffffffe638;
  int outdots;
  char extrastr [32];
  dotNode *rslts [114] [7];
  
  bVar12 = bbins == (atomBins *)0x0;
  allMovingAtoms_00 = allMovingAtoms;
  if (bVar12) {
    allMovingAtoms_00 = (atom *)0x0;
  }
  bVar13 = allMovingAtoms == (atom *)0x0;
  if (bVar13) {
    bbins = (atomBins *)0x0;
  }
  memset(rslts,0,0x18f0);
  if (((countDots == 0) && (rawOutput != 0)) && ((Verbose & 1) == 0)) {
    pcVar7 = 
    ">>name:pat:type:srcAtom:targAtom:dot-count:min-gap:gap:kissEdge2BullsEye:dot2BE:dot2SC:spike:score:stype:ttype:x:y:z:sBval:tBval"
    ;
    if (conFlag == 0) {
      pcVar7 = 
      ">>name:pat:type:srcAtom:targAtom:min-gap:gap:kissEdge2BullsEye:dot2BE:dot2SC:spike:score:stype:ttype:x:y:z:sBval:tBval"
      ;
    }
    pcVar11 = 
    ">>name:pat:type:srcAtom:targAtom:dot-count:min-gap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval"
    ;
    if (conFlag == 0) {
      pcVar11 = 
      ">>name:pat:type:srcAtom:targAtom:min-gap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval"
      ;
    }
    if (OldStyleU != '\0') {
      pcVar11 = pcVar7;
    }
    note(pcVar11);
  }
  switch(method) {
  case 0:
    if ((countDots == 0 || rawOutput == 0) && ((Verbose & 1) == 0)) {
      note("ExternalSurface");
    }
    genDotSurface(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,probeRad,spikelen,1,rslts);
    if (countDots == 0) {
      if (rawOutput == 0) {
        if (OutputFmtType != 2) {
          if (OutputFmtType != 1) {
            descrCommand(outf,"@caption"," command:",argc,argv);
            if (sayGroup != 0) {
              pcVar7 = "dots";
              if (groupLabel != (char *)0x0) {
                pcVar7 = groupLabel;
              }
              fprintf((FILE *)outf,"@group dominant {%s}\n",pcVar7);
            }
            pcVar7 = "dots";
            if (groupLabel != (char *)0x0) {
              pcVar7 = groupLabel;
            }
            strcpy(extrastr,pcVar7);
            pcVar7 = "extern dots";
            drawSpike = 0;
            iVar3 = 0;
LAB_0012be2e:
            writeOutput(outf,pcVar7,rslts,drawSpike,iVar3,extrastr,probeRad);
            break;
          }
          pcVar7 = "extern_dots";
          uVar10 = 1;
          drawSpike = 0;
LAB_0012bab6:
          writeAltFmtO(outf,uVar10,1,pcVar7,rslts,drawSpike);
          break;
        }
        descrCommand(outf,"# software:","# command:",argc,argv);
        pcVar7 = "extern_dots";
        uVar10 = 1;
        drawSpike = 0;
LAB_0012bcd4:
        writeAltFmtXV(outf,uVar10,1,pcVar7,rslts,drawSpike);
        break;
      }
      pcVar7 = "";
      if (groupLabel != (char *)0x0) {
        pcVar7 = groupLabel;
      }
      pcVar11 = "1->none";
LAB_0012ba20:
      writeRaw(outf,pcVar11,rslts,probeRad,pcVar7,density,conFlag);
      break;
    }
    if (rawOutput == 0) {
      descrCommand(outf,"program:","command:",argc,argv);
      iVar3 = enumDotSkin(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,1);
      pcVar7 = "dots";
      if (groupLabel != (char *)0x0) {
        pcVar7 = groupLabel;
      }
      fprintf((FILE *)outf,"selection: external\nname: %s\n",pcVar7);
      fprintf((FILE *)outf,
              "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
              (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
    }
    else {
      iVar3 = enumDotSkin(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,1);
    }
    if (bVar13 || bVar12) {
      iVar8 = 0;
      for (; allMainAtoms != (atom *)0x0; allMainAtoms = allMainAtoms->next) {
        iVar8 = iVar8 + (allMainAtoms->flags & 1U);
      }
    }
    else {
      iVar8 = 0;
      iVar4 = 0;
      if (allMainAtoms != (atom *)0x0) {
        iVar4 = 0;
        do {
          iVar4 = iVar4 + (allMainAtoms->flags & 1U);
          allMainAtoms = allMainAtoms->next;
        } while (allMainAtoms != (atom_t *)0x0);
      }
      if (allMovingAtoms_00 != (atom *)0x0) {
        iVar8 = 0;
        do {
          iVar8 = iVar8 + (allMovingAtoms->flags & 1U);
          allMovingAtoms = allMovingAtoms->next;
        } while (allMovingAtoms != (atom_t *)0x0);
      }
      iVar8 = iVar8 + iVar4;
    }
    if (rawOutput != 0) {
      pcVar11 = "";
      if (groupLabel == (char *)0x0) {
        groupLabel = "";
      }
      iVar4 = 0;
      drawSpike = 0;
LAB_0012bb19:
      rawEnumerate(outf,pcVar11,rslts,iVar4,iVar8,drawSpike,in_stack_ffffffffffffe638,iVar3,density,
                   groupLabel,rawname,scoreBias);
      break;
    }
    pcVar7 = "extern dots";
    iVar4 = 0;
    drawSpike = 0;
    outdots = 1;
    goto LAB_0012bb55;
  case 1:
    if ((countDots == 0 || rawOutput == 0) && ((Verbose & 1) == 0)) {
      note("IntersectOnce");
    }
    genDotIntersect(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,probeRad,spikelen,1,2,rslts);
    if (countDots == 0) {
      if (rawOutput != 0) {
        pcVar7 = "";
        if (groupLabel != (char *)0x0) {
          pcVar7 = groupLabel;
        }
        pcVar11 = "1->2";
        goto LAB_0012ba20;
      }
      if (OutputFmtType != 3) {
        if (OutputFmtType == 2) {
          descrCommand(outf,"# software:","# command:",argc,argv);
          pcVar7 = "once_dots";
          uVar10 = 1;
          goto LAB_0012bcd4;
        }
        if (OutputFmtType != 1) {
          if (ContactSUMMARY == '\x01') {
            countsummary(outf,"IntersectOnce",9,1);
          }
          descrCommand(outf,"@caption"," command:",argc,argv);
          if (sayGroup != 0) {
            pcVar7 = "dots";
            if (groupLabel != (char *)0x0) {
              pcVar7 = groupLabel;
            }
            fprintf((FILE *)outf,"@group dominant {%s}\n",pcVar7);
          }
          pcVar7 = "dots";
          if (groupLabel != (char *)0x0) {
            pcVar7 = groupLabel;
          }
          strcpy(extrastr,pcVar7);
          pcVar7 = "once dots";
          iVar3 = 1;
          goto LAB_0012be2e;
        }
        pcVar7 = "once_dots";
        uVar10 = 1;
        goto LAB_0012bab6;
      }
      pcVar7 = "IntersectOnce";
      iVar3 = 1;
      iVar8 = 1;
LAB_0012bd6a:
      countsummary(outf,pcVar7,iVar3,iVar8);
      break;
    }
    if (rawOutput == 0) {
      descrCommand(outf,"program:","command:",argc,argv);
      iVar3 = enumDotSkin(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,1);
      pcVar7 = "dots";
      if (groupLabel != (char *)0x0) {
        pcVar7 = groupLabel;
      }
      fprintf((FILE *)outf,"selection: once\nname: %s\n",pcVar7);
      fprintf((FILE *)outf,
              "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
              (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
      fprintf((FILE *)outf,"score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",(double)GAPweight,
              (double)BUMPweight,(double)HBweight);
    }
    else {
      iVar3 = enumDotSkin(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,1);
    }
    if (bVar13 || bVar12) {
      iVar8 = 0;
      for (; allMainAtoms != (atom *)0x0; allMainAtoms = allMainAtoms->next) {
        iVar8 = iVar8 + (allMainAtoms->flags & 1U);
      }
    }
    else {
      iVar8 = 0;
      iVar4 = 0;
      if (allMainAtoms != (atom *)0x0) {
        iVar4 = 0;
        do {
          iVar4 = iVar4 + (allMainAtoms->flags & 1U);
          allMainAtoms = allMainAtoms->next;
        } while (allMainAtoms != (atom_t *)0x0);
      }
      if (allMovingAtoms_00 != (atom *)0x0) {
        iVar8 = 0;
        do {
          iVar8 = iVar8 + (allMovingAtoms->flags & 1U);
          allMovingAtoms = allMovingAtoms->next;
        } while (allMovingAtoms != (atom_t *)0x0);
      }
      iVar8 = iVar8 + iVar4;
    }
    if (rawOutput != 0) {
      pcVar11 = "";
      if (groupLabel == (char *)0x0) {
        groupLabel = "";
      }
      iVar4 = 1;
      goto LAB_0012bb19;
    }
    pcVar7 = "once dots";
    iVar4 = 1;
    goto LAB_0012bb53;
  case 2:
    if ((countDots == 0 || rawOutput == 0) && ((Verbose & 1) == 0)) {
      note("IntersectBothWays");
    }
    if (countDots == 0) {
      if (OutputFmtType == 1 || rawOutput != 0) {
        genDotIntersect(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,probeRad,spikelen,1,2,rslts)
        ;
        if (rawOutput != 0) {
          pcVar7 = "";
          if (groupLabel != (char *)0x0) {
            pcVar7 = groupLabel;
          }
          writeRaw(outf,"1->2",rslts,probeRad,pcVar7,density,conFlag);
          goto LAB_0012b90f;
        }
      }
      else {
        if (OutputFmtType == 2) {
          descrCommand(outf,"# software:","# command:",argc,argv);
        }
        else {
          descrCommand(outf,"@caption"," command:",argc,argv);
          if (sayGroup != 0) {
            pcVar7 = "dots";
            if (groupLabel != (char *)0x0) {
              pcVar7 = groupLabel;
            }
            fprintf((FILE *)outf,"@group {%s}\n",pcVar7);
          }
        }
        genDotIntersect(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,probeRad,spikelen,1,2,rslts)
        ;
      }
      if (OutputFmtType == 3) {
        iVar3 = 1;
LAB_0012b908:
        countsummary(outf,"IntersectBothWays 1->2",iVar3,0);
      }
      else if (OutputFmtType == 2) {
        writeAltFmtXV(outf,1,(uint)(sayGroup == 0),"1->2",rslts,drawSpike);
      }
      else if (OutputFmtType == 1) {
        writeAltFmtO(outf,1,(uint)(sayGroup == 0),"1->2",rslts,drawSpike);
      }
      else {
        pcVar7 = "dots";
        if (groupLabel != (char *)0x0) {
          pcVar7 = groupLabel;
        }
        strcpy(extrastr,pcVar7);
        writeOutput(outf,"1->2",rslts,drawSpike,2,extrastr,probeRad);
        if (ContactSUMMARY == '\x01') {
          iVar3 = 9;
          goto LAB_0012b908;
        }
      }
    }
    else {
      if (rawOutput == 0) {
        descrCommand(outf,"program:","command:",argc,argv);
        pcVar7 = "dots";
        if (groupLabel != (char *)0x0) {
          pcVar7 = groupLabel;
        }
        fprintf((FILE *)outf,"selection: both\nname: %s\n",pcVar7);
        fprintf((FILE *)outf,
                "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
                (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
        fprintf((FILE *)outf,"score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",(double)GAPweight,
                (double)BUMPweight,(double)HBweight);
      }
      genDotIntersect(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,probeRad,spikelen,1,2,rslts);
      iVar3 = enumDotSkin(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,1);
      if (bVar13 || bVar12) {
        iVar8 = 0;
        paVar6 = allMainAtoms;
        if (allMainAtoms != (atom *)0x0) {
          do {
            iVar8 = iVar8 + (paVar6->flags & 1U);
            ppaVar2 = &paVar6->next;
            paVar6 = *ppaVar2;
          } while (*ppaVar2 != (atom_t *)0x0);
        }
      }
      else {
        iVar8 = 0;
        iVar4 = 0;
        if (allMainAtoms != (atom *)0x0) {
          iVar4 = 0;
          paVar6 = allMainAtoms;
          do {
            iVar4 = iVar4 + (paVar6->flags & 1U);
            paVar6 = paVar6->next;
          } while (paVar6 != (atom_t *)0x0);
        }
        if (allMovingAtoms_00 != (atom *)0x0) {
          iVar8 = 0;
          paVar6 = allMovingAtoms;
          do {
            iVar8 = iVar8 + (paVar6->flags & 1U);
            paVar6 = paVar6->next;
          } while (paVar6 != (atom_t *)0x0);
        }
        iVar8 = iVar8 + iVar4;
      }
      if (rawOutput == 0) {
        enumerate(outf,"1->2",rslts,probeRad,2,iVar8,drawSpike,0,iVar3,density);
      }
      else {
        pcVar7 = "";
        if (groupLabel != (char *)0x0) {
          pcVar7 = groupLabel;
        }
        rawEnumerate(outf,"1->2",rslts,2,iVar8,drawSpike,in_stack_ffffffffffffe638,iVar3,density,
                     pcVar7,rawname,scoreBias);
      }
    }
LAB_0012b90f:
    freeResults(rslts);
    memset(rslts,0,0x18f0);
    genDotIntersect(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,probeRad,spikelen,2,1,rslts);
    if (countDots == 0) {
      if (rawOutput == 0) {
        if (OutputFmtType == 3) {
          iVar3 = 1;
        }
        else {
          if (OutputFmtType == 2) {
            uVar10 = (uint)(sayGroup == 0);
            pcVar7 = "2->1";
            goto LAB_0012bcd4;
          }
          if (OutputFmtType == 1) {
            uVar10 = (uint)(sayGroup == 0);
            pcVar7 = "2->1";
            goto LAB_0012bab6;
          }
          pcVar7 = "dots";
          if (groupLabel != (char *)0x0) {
            pcVar7 = groupLabel;
          }
          strcpy(extrastr,pcVar7);
          writeOutput(outf,"2->1",rslts,drawSpike,2,extrastr,probeRad);
          if (ContactSUMMARY != '\x01') break;
          iVar3 = 9;
        }
        pcVar7 = "IntersectBothWays 2->1";
        iVar8 = 2;
        goto LAB_0012bd6a;
      }
      pcVar7 = "";
      if (groupLabel != (char *)0x0) {
        pcVar7 = groupLabel;
      }
      pcVar11 = "2->1";
      goto LAB_0012ba20;
    }
    iVar3 = enumDotSkin(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,2);
    if (bVar13 || bVar12) {
      if (allMainAtoms == (atom *)0x0) {
        iVar8 = 0;
      }
      else {
        iVar8 = 0;
        do {
          iVar8 = iVar8 + (uint)(((uint)allMainAtoms->flags >> 1 & 1) != 0);
          allMainAtoms = allMainAtoms->next;
        } while (allMainAtoms != (atom_t *)0x0);
      }
    }
    else {
      iVar8 = 0;
      iVar4 = 0;
      if (allMainAtoms != (atom *)0x0) {
        iVar4 = 0;
        do {
          iVar4 = iVar4 + (uint)(((uint)allMainAtoms->flags >> 1 & 1) != 0);
          allMainAtoms = allMainAtoms->next;
        } while (allMainAtoms != (atom_t *)0x0);
      }
      if (allMovingAtoms_00 != (atom *)0x0) {
        iVar8 = 0;
        do {
          iVar8 = iVar8 + (uint)(((uint)allMovingAtoms->flags >> 1 & 1) != 0);
          allMovingAtoms = allMovingAtoms->next;
        } while (allMovingAtoms != (atom_t *)0x0);
      }
      iVar8 = iVar8 + iVar4;
    }
    if (rawOutput != 0) {
      pcVar7 = "";
      if (groupLabel != (char *)0x0) {
        pcVar7 = groupLabel;
      }
      pcVar11 = "2->1";
      iVar4 = 2;
      groupLabel = pcVar7;
      goto LAB_0012bb19;
    }
    pcVar7 = "2->1";
    iVar4 = 2;
LAB_0012bb53:
    outdots = 0;
LAB_0012bb55:
    enumerate(outf,pcVar7,rslts,probeRad,iVar4,iVar8,drawSpike,outdots,iVar3,density);
    break;
  case 3:
    if ((countDots == 0 || rawOutput == 0) && ((Verbose & 1) == 0)) {
      note("SelfIntersect");
    }
    uVar5 = (ulong)(uint)modelCount;
    if (modelCount < 2) {
      uVar5 = 1;
    }
    if (modelTarg != 0 || modelSrc != 0) {
      uVar5 = 1;
    }
    modelLimit = (int)uVar5;
    pcVar7 = "dots";
    if (groupLabel != (char *)0x0) {
      pcVar7 = groupLabel;
    }
    if (groupLabel == (char *)0x0) {
      groupLabel = "";
    }
    uVar9 = 1;
    do {
      if ((1 < (int)uVar5) && (modelToProcess = modelNumber[uVar9], Verbose == 0)) {
        fprintf(_stderr,"processing modelNumber== %d\n");
      }
      if (1 < uVar9) {
        freeResults(rslts);
        memset(rslts,0,0x18f0);
      }
      genDotIntersect(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,probeRad,spikelen,1,1,rslts);
      if (countDots == 0) {
        if (rawOutput == 0) {
          if (OutputFmtType == 3) {
            countsummary(outf,"SelfIntersect",1,1);
          }
          else if (OutputFmtType == 2) {
            descrCommand(outf,"# software:","# command:",argc,argv);
            writeAltFmtXV(outf,1,1,"self_dots",rslts,drawSpike);
          }
          else if (OutputFmtType == 1) {
            writeAltFmtO(outf,1,1,"self_dots",rslts,drawSpike);
          }
          else {
            if (ContactSUMMARY == '\x01') {
              countsummary(outf,"SelfIntersect",9,1);
            }
            descrCommand(outf,"@caption"," command:",argc,argv);
            if (sayGroup != 0) {
              if (modelLimit < 2) {
                fprintf((FILE *)outf,"@group dominant {%s}\n",pcVar7);
              }
              else {
                fprintf((FILE *)outf,"@group dominant {%s M%d} animate\n",pcVar7,uVar9 & 0xffffffff)
                ;
              }
            }
            strcpy(extrastr,pcVar7);
            writeOutput(outf,"self dots",rslts,drawSpike,3,extrastr,probeRad);
          }
        }
        else {
          writeRaw(outf,"1->1",rslts,probeRad,groupLabel,density,conFlag);
        }
      }
      else {
        if (rawOutput == 0) {
          descrCommand(outf,"program:","command:",argc,argv);
          iVar3 = enumDotSkin(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,1);
          fprintf((FILE *)outf,"selection: self\nname: %s\n",pcVar7);
          fprintf((FILE *)outf,
                  "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
                  (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
          fprintf((FILE *)outf,"score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",(double)GAPweight,
                  (double)BUMPweight,(double)HBweight);
        }
        else {
          iVar3 = enumDotSkin(allMainAtoms,abins,allMovingAtoms_00,bbins,dots,1);
        }
        if (bVar13 || bVar12) {
          iVar8 = 0;
          paVar6 = allMainAtoms;
          if (allMainAtoms != (atom *)0x0) {
            do {
              iVar8 = iVar8 + (paVar6->flags & 1U);
              ppaVar2 = &paVar6->next;
              paVar6 = *ppaVar2;
            } while (*ppaVar2 != (atom_t *)0x0);
          }
        }
        else {
          iVar8 = 0;
          iVar4 = 0;
          if (allMainAtoms != (atom *)0x0) {
            iVar4 = 0;
            paVar6 = allMainAtoms;
            do {
              iVar4 = iVar4 + (paVar6->flags & 1U);
              paVar6 = paVar6->next;
            } while (paVar6 != (atom_t *)0x0);
          }
          if (allMovingAtoms_00 != (atom *)0x0) {
            iVar8 = 0;
            paVar6 = allMovingAtoms;
            do {
              iVar8 = iVar8 + (paVar6->flags & 1U);
              paVar6 = paVar6->next;
            } while (paVar6 != (atom_t *)0x0);
          }
          iVar8 = iVar8 + iVar4;
        }
        if (rawOutput == 0) {
          enumerate(outf,"self dots",rslts,probeRad,3,iVar8,drawSpike,0,iVar3,density);
        }
        else {
          rawEnumerate(outf,"",rslts,3,iVar8,drawSpike,in_stack_ffffffffffffe638,iVar3,density,
                       groupLabel,rawname,scoreBias);
        }
      }
      uVar5 = (ulong)modelLimit;
      bVar1 = (long)uVar9 < (long)uVar5;
      uVar9 = uVar9 + 1;
    } while (bVar1);
    break;
  case 4:
    if ((rawOutput == 0) && ((Verbose & 1) == 0)) {
      note("dumpAtomInfo");
      descrCommand(outf,"program:","command:",argc,argv);
      pcVar7 = "dots";
      if (groupLabel != (char *)0x0) {
        pcVar7 = groupLabel;
      }
      fprintf((FILE *)outf,"selection: self\nname: %s\n",pcVar7);
      fprintf((FILE *)outf,
              "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
              (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
      fprintf((FILE *)outf,"score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",(double)GAPweight,
              (double)BUMPweight,(double)HBweight);
    }
    if (bVar13 || bVar12) {
      uVar5 = 0;
      for (; allMainAtoms != (atom *)0x0; allMainAtoms = allMainAtoms->next) {
        uVar5 = (ulong)((int)uVar5 + (allMainAtoms->flags & 1U));
      }
    }
    else {
      iVar8 = 0;
      iVar3 = 0;
      if (allMainAtoms != (atom *)0x0) {
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (allMainAtoms->flags & 1U);
          allMainAtoms = allMainAtoms->next;
        } while (allMainAtoms != (atom_t *)0x0);
      }
      if (allMovingAtoms_00 != (atom *)0x0) {
        iVar8 = 0;
        do {
          iVar8 = iVar8 + (allMovingAtoms->flags & 1U);
          allMovingAtoms = allMovingAtoms->next;
        } while (allMovingAtoms != (atom_t *)0x0);
      }
      uVar5 = (ulong)(uint)(iVar8 + iVar3);
    }
    if (rawOutput == 0) {
      fprintf((FILE *)outf,"atoms selected: %d\n",uVar5);
    }
    else if (groupLabel == (char *)0x0) {
      fprintf((FILE *)outf,"%d %s\n",uVar5,rawname);
    }
    else {
      fprintf((FILE *)outf,"%d %s %s%s\n",uVar5,rawname,"#",groupLabel);
    }
  }
  freeResults(rslts);
  return;
}

Assistant:

void doCommand(FILE *outf, int method,
   atom *allMainAtoms, atomBins *abins,
   atom *allMovingAtoms, atomBins *bbins,
   pointSet dots[], float probeRad, float density, float spikelen,
   int countDots, int rawOutput, int conFlag, char* rawname, double scoreBias,
   int drawSpike, int sayGroup, char* groupLabel,
   int argc, char **argv, char message[])
{

/* NOTE: allMainAtoms/abins & allMovingAtoms/bbins must be disjoint */
/*       sets of atoms (none in common) or allMovingAtoms/bbins can */
/*       be NULL.                                                   */
/*       allMovingAtoms refers to autobondrot set of atoms          */

   /*doCommand is called from mainProbeProc() with rawname=="" */
   /* and called from movingDoCommand() with rawname==orientationName */
   /* which holds the string of the current autobondrot cycle's angle values*/
   /*for autobondrot: method is set by probe command, e.g. */
   /* INTERSECTONCE==1 as used in example of mobile sidechain in a protein */
   /* SELFINTERSECT==3 as used by alaphitaupsi ramachandran calculation*/
   /* autobondrot option defines: countDots==1, rawOutput==1*/
   /* autobondrot seems to get here with: drawSpike==1*/

   dotNode *rslts[NUMATOMTYPES][NODEWIDTH];
   int nsel = 0, numSkinDots = 0;
   int usesMovingAtoms = FALSE;

   int  j=0;

   char extrastr[32]; /*060129 for extra master to control orig vs fitted dots*/

   /*allMovingAtoms is closest thing to a flag for autobondrot mode*/
   /*so if it exists and bbins exist (dcr?: mobile atoms near enough?) */
   /*then usesMovingAtoms becomes the flag for autobondrot mode */
   /*in effect probe is modal but too object oriented to admit such globalness*/

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));
   if (! usesMovingAtoms)
   {
	allMovingAtoms = NULL;
	bbins = NULL;
   }

   initResults(rslts);
   if (!countDots && rawOutput && Verbose)
   { /*write rawOutput col headers*/
        if (OldStyleU)
        {
        	if(conFlag)
        		note(">>name:pat:type:srcAtom:targAtom:dot-count:min-gap:gap:"
        		"kissEdge2BullsEye:dot2BE:dot2SC:spike:score:"
        		"stype:ttype:x:y:z:sBval:tBval");
        	else
        		note(">>name:pat:type:srcAtom:targAtom:min-gap:gap:"
        		"kissEdge2BullsEye:dot2BE:dot2SC:spike:score:"
        		"stype:ttype:x:y:z:sBval:tBval");
       }
       else
       {
       	       if(conFlag)
       	      		 note(">>name:pat:type:srcAtom:targAtom:dot-count:min-gap:gap:"
       	       	       "spX:spY:spZ:spikeLen:score:"
              	       "stype:ttype:x:y:z:sBval:tBval");
              else
              	   note(">>name:pat:type:srcAtom:targAtom:min-gap:gap:"
       	       	       "spX:spY:spZ:spikeLen:score:"
              	       "stype:ttype:x:y:z:sBval:tBval");
       }
   }/*write rawOutput col headers*/
   if (method == SELFINTERSECT)
   {/*{{{(method == SELFINTERSECT)___expected default method___****/
   	   if (Verbose && !(countDots && rawOutput))
   		note("SelfIntersect");

    /*SELFINTERSECT case, using one input file (and where srcPat == targPat)*/
    /*is where unwashed NMR files with multiple models can be processed */
    /*when there is not a single model specified in the pattern.*/
    /*This uses a loop through all the model numbers actually in the file.*/

    	  if(modelSrc == 0 && modelTarg == 0 && modelCount > 1) /*041114*/ /*multiple models in file but no model specified in pattern*/
    	        modelLimit = modelCount;
          else
   		modelLimit = 1;

   	  for(j = 1; j <= modelLimit; j++) /*041114*/
   	  {/*loop over models*/

   	  	  if(modelLimit > 1)
   	  	  {/*defines the multiple model case*/
   	  	  	  modelToProcess = modelNumber[j]; /*models can be in any order 041114*/
   	  	  	  if(Verbose)
   	  	  	    	  fprintf(stderr,"processing modelNumber== %d\n",modelNumber[j]);
   	  	  }
   	  	  if(j > 1)
   	  	  {
   	  	  	  freeResults(rslts);
   	  	  	  initResults(rslts);
   	  	  }
   	  	  genDotIntersect(allMainAtoms, abins, allMovingAtoms, bbins,dots, probeRad, spikelen,SET1, SET1, rslts);
   	  	  /*does this for all atoms... calls examineDots()*/

          
   	  	  if (countDots)
   	  	  {/*autobondrot sets this, commandline can set this*/
   	  	  	  if (!rawOutput) {descrCommand(outf, "program:", "command:", argc, argv);}
   	  	  	  numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET1);
   	  	  	  /*numSkinDots used to normalize output score*/
   	  	  	  if (!rawOutput)
   	  	  	  {
   	  	  	  	  fprintf(outf, "selection: self\nname: %s\n", groupLabel?groupLabel:"dots");
   	  	  	  	  fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
   	  	  	  	  	  density, probeRad, RadScaleFactor, RadScaleOffset);
   	  	  	  	  fprintf(outf, "score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",
   	  	  	  	  	  GAPweight, BUMPweight, HBweight);
   	  	  	  }
   	  	  	  if (usesMovingAtoms)
   	  	  	    	  nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
   	  	  	  else
   	  	  	    	  nsel = countSelected(allMainAtoms, SET1);

   	  	  	  if (rawOutput)
   	  	  	  {/*autobondrot sets this*/
   	  	  	  	  rawEnumerate(outf, "", rslts, method,
   	  	  	  	  	  nsel, drawSpike, FALSE, numSkinDots, density,
   	  	  	  	  	  groupLabel?groupLabel:"", rawname, scoreBias);
   	  	  	  }
   	  	  	  else
   	  	  	  {
   	  	  	  	  enumerate(outf, "self dots", rslts, probeRad, method, nsel,
   	  	  	  	  	  drawSpike, FALSE, numSkinDots, density);
   	  	  	  }
   	  	  }/*countDots*/
   	  	  else
   	  	  {
   	  	  	  if (rawOutput)
				{
   	  	  	    	  writeRaw(outf, "1->1", rslts, probeRad,groupLabel?groupLabel:"", density,conFlag);
				}
   	  	  	  else if (OutputFmtType == 1)
   	  	  	   	  writeAltFmtO(outf, TRUE, TRUE, "self_dots", rslts, drawSpike);
   	  	  	  else if (OutputFmtType == 2)
   	  	  	  {
   	  	  	  	  descrCommand(outf, "# software:", "# command:", argc, argv);
   	  	  	  	  writeAltFmtXV(outf, TRUE, TRUE, "self_dots", rslts, drawSpike);
   	  	  	  }
   	  	  	  else if (OutputFmtType == 3)
   	  	  	  { /*dcr041101 ONELINE :count:summaries:*/
   	  	  	  	  countsummary(outf,"SelfIntersect", 1, 1); /*dcr041101 Lines,Pass*/
   	  	  	  }
   	  	  	  else
   	  	  	  {/*kinemage output*/
   	  	  	  	  if(ContactSUMMARY) /*dcr041101 Lines,Pass*/
   	  	  	  	    	countsummary(outf,"SelfIntersect", 9, 1);

   	  	  	  	  descrCommand(outf, "@caption", " command:", argc, argv);

   	  	  	  	  if (sayGroup)
   	  	  	  	  {
   	  	  	  	  	  if(modelLimit > 1)
   	  	  	  	  	  {/*doing jth of multiple models of an ensemble*/
   	  	  	  	  	  	  fprintf(outf, "@group dominant {%s M%d} animate\n",groupLabel?groupLabel:"dots",j);
   	  	  	  	  	  }
   	  	  	  	  	  else
   	  	  	  	  	    	  fprintf(outf, "@group dominant {%s}\n",groupLabel?groupLabel:"dots");
   	  	  	  	  }
   	  	  	  	  sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
                  writeOutput(outf, "self dots", rslts, drawSpike, method, extrastr, probeRad);
                           /*add probeRad 20111220dcr*/
   	  	  	  }/*kinemage output*/
   	  	  }
   	  }/*loop over models*/
   }/*}}}(method == SELFINTERSECT)________________________________*/

   else if (method == INTERSECTONCE)
   {/*{{{(method == INTERSECTONCE)*********************************/
      if (Verbose && !(countDots && rawOutput))
      	      note("IntersectOnce");

      genDotIntersect(allMainAtoms, abins, allMovingAtoms, bbins,dots, probeRad, spikelen, SET1, SET2, rslts);

      if (countDots)
      {/*autobondrot sets this*/
      	      if (!rawOutput)
      	      	      descrCommand(outf, "program:", "command:", argc, argv);

      	      numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET1);
         /*numSkinDots used to normalize output score*/
              if (!rawOutput)
	      {
	 	     fprintf(outf, "selection: once\nname: %s\n", groupLabel?groupLabel:"dots");
	 	     fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
	 	     	     density, probeRad, RadScaleFactor, RadScaleOffset);
		     fprintf(outf, "score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",
		     	     GAPweight, BUMPweight, HBweight);
	      }
	      if (usesMovingAtoms)
	      	      nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
              else
              	      nsel = countSelected(allMainAtoms, SET1);

              if (rawOutput)
              {/*autobondrot sets this*/
              	      rawEnumerate(outf,"", rslts, method, nsel,
              	      	      drawSpike, FALSE, numSkinDots, density,
              	      	      groupLabel?groupLabel:"", rawname, scoreBias);
              }
              else
              {
              	      enumerate(outf,"once dots", rslts, probeRad, method, nsel,
              	      	      drawSpike, FALSE, numSkinDots, density);
              }
      }
      else
      {
      	      if (rawOutput)
		{
      	      	    writeRaw(outf, "1->2", rslts, probeRad,groupLabel?groupLabel:"", density,conFlag);

		}
		else if (OutputFmtType == 1)
	      	      writeAltFmtO(outf, TRUE, TRUE, "once_dots", rslts, drawSpike);
	      else if (OutputFmtType == 2)
	      {
	      	      descrCommand(outf, "# software:", "# command:", argc, argv);
	      	      writeAltFmtXV(outf, TRUE, TRUE, "once_dots", rslts, drawSpike);
	      }
	      else if (OutputFmtType == 3)
	      { /*dcr041101 ONELINE :count:summaries:*/
	      	      countsummary(outf,"IntersectOnce", 1, 1); /*dcr041101 Lines,Pass*/
	      }
	      else
	      {/*write kinemage*/
	      	      if(ContactSUMMARY) /*dcr041101 Lines,Pass*/
               			countsummary(outf,"IntersectOnce", 9, 1);

               	      descrCommand(outf, "@caption", " command:", argc, argv);
               	      if (sayGroup)
               	      	      fprintf(outf, "@group dominant {%s}\n", groupLabel?groupLabel:"dots");

               	      sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
                         writeOutput(outf, "once dots", rslts, drawSpike, method, extrastr, probeRad);
                         /*add probeRad 20111220dcr*/
              }
      }
   }/*}}}(method == INTERSECTONCE)________________________________*/

   else if (method == INTERSECTBOTHWAYS)
   {/*{{{(method == INTERSECTBOTHWAYS)*****************************/
      if (Verbose && !(countDots && rawOutput))
      		note("IntersectBothWays");

      if (countDots)
      {
	 if (!rawOutput)
	 {
	    descrCommand(outf, "program:", "command:", argc, argv);
	    fprintf(outf, "selection: both\nname: %s\n", groupLabel?groupLabel:"dots");
	    fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
				 density, probeRad, RadScaleFactor, RadScaleOffset);
	    fprintf(outf, "score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",
				 GAPweight, BUMPweight, HBweight);
	 }
      }
      else
      {
      	      if (rawOutput) {}
		   /* do nothing on purpose */
	      else if (OutputFmtType == 1) {}
	      else if (OutputFmtType == 2)
	      	      descrCommand(outf, "# software:", "# command:", argc, argv);
	      else
	      {/*kinemage: keywords before double pass*/
	      	      descrCommand(outf, "@caption", " command:", argc, argv);
	      	      if (sayGroup)
	      	      		fprintf(outf, "@group {%s}\n",groupLabel?groupLabel:"dots");
	    }
      }

      genDotIntersect(allMainAtoms, abins, allMovingAtoms, bbins,
		  dots, probeRad, spikelen, SET1, SET2, rslts);

      if (countDots)
      {
	 numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET1);
         /*numSkinDots used to normalize output score*/
	 if (usesMovingAtoms)
	     nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
	 else
             nsel = countSelected(allMainAtoms, SET1);

	 if (rawOutput)
	 {
	    rawEnumerate(outf, "1->2", rslts, method, nsel,
			drawSpike, FALSE, numSkinDots, density,
			groupLabel?groupLabel:"", rawname, scoreBias);
	 }
	 else
	 {
	    enumerate(outf, "1->2", rslts, probeRad, method, nsel,
			drawSpike, FALSE, numSkinDots, density);
	 }
      }
      else
      {
	 if (rawOutput)
	{
	    writeRaw(outf, "1->2", rslts, probeRad, groupLabel?groupLabel:"", density,conFlag);

	}
	else if (OutputFmtType == 1)
	    writeAltFmtO(outf, TRUE, !sayGroup, "1->2", rslts, drawSpike);
	 else if (OutputFmtType == 2)
	    writeAltFmtXV(outf, TRUE, !sayGroup, "1->2", rslts, drawSpike);
	 else if (OutputFmtType == 3)
	 { /*dcr041101 ONELINE :count:summaries:*/
            countsummary(outf,"IntersectBothWays 1->2", 1, 0);
            /*dcr041101 Lines,Pass==0 no output for this pass*/
	 }
	 else
	 {
            sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
        writeOutput(outf, "1->2", rslts, drawSpike, method, extrastr,probeRad);
        /*add probeRad 20111220dcr*/

            if(ContactSUMMARY) /*dcr041101 Lines,Pass*/
             	countsummary(outf,"IntersectBothWays 1->2", 9, 0);
               /*dcr041101 Lines,Pass==0 no output for this pass*/
	 }
      }
      freeResults(rslts);
      initResults(rslts);

      genDotIntersect(allMainAtoms, abins, allMovingAtoms, bbins,
			dots, probeRad, spikelen, SET2, SET1, rslts);

      if (countDots)
      {
	 numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET2);
         /*numSkinDots used to normalize output score*/
	 if (usesMovingAtoms)
	 	 nsel = countSelected(allMainAtoms,   SET2) + countSelected(allMovingAtoms, SET2);
	 else
	 	 nsel = countSelected(allMainAtoms, SET2);

	 if (rawOutput)
	 {
	    rawEnumerate(outf, "2->1", rslts, method, nsel,
			drawSpike, FALSE, numSkinDots, density,
			groupLabel?groupLabel:"", rawname, scoreBias);
	 }
	 else
	 {
	    enumerate(outf, "2->1", rslts, probeRad, method, nsel,
			drawSpike, FALSE, numSkinDots, density);
	 }
      }
      else
      {
	 if (rawOutput)
	 {
         writeRaw(outf, "2->1", rslts, probeRad,
			groupLabel?groupLabel:"", density,conFlag);

	 }
	 else if (OutputFmtType == 1)
	 {
	    writeAltFmtO(outf, !sayGroup, TRUE, "2->1", rslts, drawSpike);
	 }
	 else if (OutputFmtType == 2)
	 {
	    writeAltFmtXV(outf, !sayGroup, TRUE, "2->1", rslts, drawSpike);
	 }
	 else if (OutputFmtType == 3)
	 { /*dcr041101 ONELINE :count:summaries:*/
            countsummary(outf,"IntersectBothWays 2->1", 1, 2);
            /*dcr041101 Lines,Pass==2 output sum of 2 passes*/
	 }
	 else
	 {
            sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
        writeOutput(outf, "2->1", rslts, drawSpike, method, extrastr, probeRad);
        /*add probeRad 20111220dcr*/

            if(ContactSUMMARY) /*dcr041101 Lines,Pass*/
               countsummary(outf,"IntersectBothWays 2->1", 9, 2);
               /*dcr041101 Lines,Pass==2 output sum of 2 passes*/
	 }
      }
   }/*}}}(method == INTERSECTBOTHWAYS)____________________________*/

   else if (method == EXTERNALSURFACE)
   {/*{{{(method == EXTERNALSURFACE)*******************************/
      if (Verbose && !(countDots && rawOutput))
      	      note("ExternalSurface");

      genDotSurface(allMainAtoms, abins, allMovingAtoms, bbins, dots, probeRad, spikelen, SET1, rslts);

      if (countDots)
      {
	 if (!rawOutput)
	    descrCommand(outf, "program:", "command:", argc, argv);

	 numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET1);
         /*numSkinDots used to normalize output score*/
	 if (!rawOutput)
	 {
	    fprintf(outf, "selection: external\nname: %s\n",groupLabel?groupLabel:"dots");
	    fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
		     density, probeRad, RadScaleFactor, RadScaleOffset);
	 }
	 if (usesMovingAtoms)
	 	 nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
	 else
	 	 nsel = countSelected(allMainAtoms, SET1);

	 if (rawOutput)
	 {
	    rawEnumerate(outf, "", rslts, method, nsel,
		     FALSE, TRUE, numSkinDots, density,
		     groupLabel?groupLabel:"", rawname, scoreBias);
	 }
	 else
	 {
	    enumerate(outf, "extern dots", rslts, probeRad, method, nsel,
		     FALSE, TRUE, numSkinDots, density);
	 }
      }
      else
      {
	 if (rawOutput)
	 {
	    writeRaw(outf, "1->none", rslts, probeRad,
		  groupLabel?groupLabel:"", density,conFlag);

	 }
	 else if (OutputFmtType == 1)
	 {
	    writeAltFmtO(outf, TRUE, TRUE, "extern_dots", rslts, FALSE);
	 }
	 else if (OutputFmtType == 2)
	 {
	    descrCommand(outf, "# software:", "# command:", argc, argv);
	    writeAltFmtXV(outf, TRUE, TRUE, "extern_dots", rslts, FALSE);
	 }
	 else
	 {
	    descrCommand(outf, "@caption", " command:", argc, argv);
	    if (sayGroup)
	       	fprintf(outf, "@group dominant {%s}\n", groupLabel?groupLabel:"dots");

            sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
        writeOutput(outf, "extern dots", rslts, FALSE, method, extrastr, probeRad);
        /*add probeRad 20111220dcr*/
	 }
      }
   }/*}}}(method == EXTERNALSURFACE)______________________________*/

   else if (method == DUMPATOMCOUNT)
   {/*{{{(method == DUMPATOMCOUNT)*********************************/
      if (Verbose && !rawOutput)
      {
	 note("dumpAtomInfo");
	 descrCommand(outf, "program:", "command:", argc, argv);
	 fprintf(outf, "selection: self\nname: %s\n", groupLabel?groupLabel:"dots");
	 fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
				 density, probeRad, RadScaleFactor, RadScaleOffset);
	 fprintf(outf, "score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",
				 GAPweight, BUMPweight, HBweight);
      }
      if (usesMovingAtoms)
	 nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
      else
	 nsel = countSelected(allMainAtoms, SET1);

      if (rawOutput)
      {
	 if (groupLabel)
	 {
	    fprintf(outf, "%d %s %s%s\n", nsel, rawname,
	       RAW_HEADER_COMMENT, groupLabel);
	 }
	 else
	 {
	    fprintf(outf, "%d %s\n", nsel, rawname);
	 }
      }
      else
      {
	 fprintf(outf, "atoms selected: %d\n", nsel);
      }
   }/*}}}(method == DUMPATOMCOUNT)_______________________________*/

   freeResults(rslts);

}